

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildingUnitTiles.cpp
# Opt level: O2

void __thiscall
BuildingUnitTiles::setBuildingUnitTiles
          (BuildingUnitTiles *this,Buildings b,Units u,int zone,int durability,int reward,
          Rewards rewardType,bool isUnit)

{
  bool in_stack_00000010;
  
  this->building = b;
  this->unit = u;
  this->zone = zone;
  this->durability = durability;
  this->reward = reward;
  this->rewardType = rewardType;
  this->isUnit = in_stack_00000010;
  return;
}

Assistant:

void BuildingUnitTiles::setBuildingUnitTiles(BuildingUnitTiles::Buildings b, BuildingUnitTiles::Units u, int zone, int durability, int reward,
                                             BuildingUnitTiles::Rewards rewardType, bool isUnit) {
    this->building = b;
    this->unit = u;
    this->zone = zone;
    this->durability = durability;
    this->reward = reward;
    this->rewardType = rewardType;
    this->isUnit = isUnit;
}